

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBucket::Finalize(LargeHeapBucket *this)

{
  Recycler *recycler_00;
  Recycler *recycler;
  LargeHeapBucket *this_local;
  
  recycler_00 = ((this->super_HeapBucket).heapInfo)->recycler;
  Finalize(this,recycler_00,this->largeBlockList);
  Finalize(this,recycler_00,this->largePageHeapBlockList);
  Finalize(this,recycler_00,this->fullLargeBlockList);
  Finalize(this,recycler_00,this->pendingDisposeLargeBlockList);
  return;
}

Assistant:

void
LargeHeapBucket::Finalize()
{
    Recycler* recycler = this->heapInfo->recycler;

    // Finalize any free objects in the non-filled large heap blocks
    Finalize(recycler, largeBlockList);

#ifdef RECYCLER_PAGE_HEAP
    Finalize(recycler, largePageHeapBlockList);
#endif

    // Finalize any free objects in the filled large heap blocks
    Finalize(recycler, fullLargeBlockList);

    // Finalize any free objects in the large heap blocks which have objects pending dispose
    // This is to handle the case where if during dispose, a GC is triggered, we might have
    // found more objects to free. These objects might reside in a block that was moved to the
    // pendingDisposeLargeBlockList during the outer GC. So we need to walk through this list
    // again and finalize any objects that need to be finalized. If we don't, they would
    // not get finalized
    Finalize(recycler, pendingDisposeLargeBlockList);
}